

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::geS(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  bool bVar2;
  bool bVar3;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == i64) {
    bVar3 = SBORROW8((this->field_0).i64,(other->field_0).i64);
    bVar2 = (this->field_0).i64 - (other->field_0).i64 < 0;
  }
  else {
    if (BVar1 != i32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x5ab);
    }
    bVar3 = SBORROW4((this->field_0).i32,(other->field_0).i32);
    bVar2 = (this->field_0).i32 - (other->field_0).i32 < 0;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)(bVar3 == bVar2);
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::geS(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 >= other.i32);
    case Type::i64:
      return Literal(i64 >= other.i64);
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}